

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O1

char * tcmalloc::GetProgramInvocationName(void)

{
  if (GetProgramInvocationName()::argv0 == '\0') {
    GetProgramInvocationName();
  }
  return GetProgramInvocationName::argv0;
}

Assistant:

const char* GetProgramInvocationName() {
#if defined(__linux__) || defined(__NetBSD__)
  // Those systems have functional procfs. And we can simply readlink
  // /proc/self/exe.
  static const char* argv0 = readlink_strdup("/proc/self/exe");
  return argv0;
#elif defined(__sun__)
  static const char* argv0 = readlink_strdup("/proc/self/path/a.out");
  return argv0;
#elif defined(HAVE_PROGRAM_INVOCATION_NAME)
  extern char* program_invocation_name;  // gcc provides this
  return program_invocation_name;
#elif defined(__MACH__)
  // We don't want to allocate memory for this since we may be
  // calculating it when memory is corrupted.
  static char program_invocation_name[PATH_MAX];
  if (program_invocation_name[0] == '\0') {  // first time calculating
    uint32_t length = sizeof(program_invocation_name);
    if (_NSGetExecutablePath(program_invocation_name, &length))
      return nullptr;
  }
  return program_invocation_name;
#elif defined(__FreeBSD__)
  static char program_invocation_name[PATH_MAX];
  size_t len = sizeof(program_invocation_name);
  static const int name[4] = { CTL_KERN, KERN_PROC, KERN_PROC_PATHNAME, -1 };
  if (!sysctl(name, 4, program_invocation_name, &len, nullptr, 0))
    return program_invocation_name;
  return nullptr;
#else
  return nullptr; // figure out a way to get argv[0]
#endif
}